

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O2

void __thiscall
leveldb::CorruptionTest_TableFileIndexData_Test::~CorruptionTest_TableFileIndexData_Test
          (CorruptionTest_TableFileIndexData_Test *this)

{
  CorruptionTest::~CorruptionTest(&this->super_CorruptionTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(CorruptionTest, TableFileIndexData) {
  Build(10000);  // Enough to build multiple Tables
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();

  Corrupt(kTableFile, -2000, 500);
  Reopen();
  Check(5000, 9999);
}